

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynIfElse * ParseIfElse(ParseContext *ctx,bool forceStaticIf)

{
  Lexeme *begin;
  IntrusiveList<SynVariableDefinition> definitions_00;
  bool bVar1;
  SynVariableDefinition *node;
  Lexeme *pLVar2;
  Lexeme *pLVar3;
  bool local_81;
  SynIfElse *local_80;
  SynBase *falseBlock;
  SynBase *trueBlock;
  SynVariableDefinition *definition;
  IntrusiveList<SynVariableDefinition> definitions;
  SynBase *type;
  SynBase *condition;
  Lexeme *conditionPos;
  bool staticIf;
  Lexeme *start;
  bool forceStaticIf_local;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  local_81 = true;
  if (!forceStaticIf) {
    local_81 = ParseContext::Consume(ctx,lex_at);
  }
  bVar1 = ParseContext::Consume(ctx,lex_if);
  if (bVar1) {
    anon_unknown.dwarf_fc7e::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'if\'");
    pLVar2 = ctx->currentLexeme;
    type = (SynBase *)0x0;
    if ((local_81 == false) &&
       (definitions.tail = (SynVariableDefinition *)ParseType(ctx,(bool *)0x0,false),
       definitions.tail != (SynVariableDefinition *)0x0)) {
      IntrusiveList<SynVariableDefinition>::IntrusiveList
                ((IntrusiveList<SynVariableDefinition> *)&definition);
      node = ParseVariableDefinition(ctx);
      if (node == (SynVariableDefinition *)0x0) {
        ctx->currentLexeme = pLVar2;
      }
      else {
        IntrusiveList<SynVariableDefinition>::push_back
                  ((IntrusiveList<SynVariableDefinition> *)&definition,node);
        type = &ParseContext::get<SynVariableDefinitions>(ctx)->super_SynBase;
        pLVar2 = ParseContext::Previous(ctx);
        definitions_00.tail = definitions.head;
        definitions_00.head = definition;
        SynVariableDefinitions::SynVariableDefinitions
                  ((SynVariableDefinitions *)type,begin,pLVar2,(SynAlign *)0x0,
                   &(definitions.tail)->super_SynBase,definitions_00);
      }
    }
    if (type == (SynBase *)0x0) {
      type = ParseAssignment(ctx);
    }
    if (type == (SynBase *)0x0) {
      pLVar2 = ParseContext::Current(ctx);
      anon_unknown.dwarf_fc7e::Report(ctx,pLVar2,"ERROR: condition not found in \'if\' statement");
      type = &ParseContext::get<SynError>(ctx)->super_SynBase;
      pLVar2 = ParseContext::Current(ctx);
      pLVar3 = ParseContext::Current(ctx);
      SynError::SynError((SynError *)type,pLVar2,pLVar3);
    }
    anon_unknown.dwarf_fc7e::CheckConsume
              (ctx,lex_cparen,"ERROR: closing \')\' not found after \'if\' condition");
    falseBlock = ParseExpression(ctx);
    if (falseBlock == (SynBase *)0x0) {
      pLVar2 = ParseContext::Current(ctx);
      anon_unknown.dwarf_fc7e::Report(ctx,pLVar2,"ERROR: expression not found after \'if\'");
      falseBlock = &ParseContext::get<SynError>(ctx)->super_SynBase;
      pLVar2 = ParseContext::Current(ctx);
      pLVar3 = ParseContext::Current(ctx);
      SynError::SynError((SynError *)falseBlock,pLVar2,pLVar3);
    }
    local_80 = (SynIfElse *)0x0;
    if ((local_81 != false) && (bVar1 = ParseContext::At(ctx,lex_semicolon), bVar1)) {
      ParseContext::Skip(ctx);
    }
    bVar1 = ParseContext::Consume(ctx,lex_else);
    if (bVar1) {
      bVar1 = ParseContext::At(ctx,lex_if);
      if (bVar1) {
        local_80 = ParseIfElse(ctx,local_81);
      }
      else {
        local_80 = (SynIfElse *)ParseExpression(ctx);
      }
      if (local_80 == (SynIfElse *)0x0) {
        pLVar2 = ParseContext::Current(ctx);
        anon_unknown.dwarf_fc7e::Report(ctx,pLVar2,"ERROR: expression not found after \'else\'");
        local_80 = (SynIfElse *)ParseContext::get<SynError>(ctx);
        pLVar2 = ParseContext::Current(ctx);
        pLVar3 = ParseContext::Current(ctx);
        SynError::SynError((SynError *)local_80,pLVar2,pLVar3);
      }
      if ((local_81 != false) && (bVar1 = ParseContext::At(ctx,lex_semicolon), bVar1)) {
        ParseContext::Skip(ctx);
      }
    }
    ctx_local = (ParseContext *)ParseContext::get<SynIfElse>(ctx);
    pLVar2 = ParseContext::Previous(ctx);
    SynIfElse::SynIfElse
              ((SynIfElse *)ctx_local,begin,pLVar2,local_81,type,falseBlock,&local_80->super_SynBase
              );
  }
  else {
    if (local_81 != false) {
      ctx->currentLexeme = begin;
    }
    ctx_local = (ParseContext *)0x0;
  }
  return (SynIfElse *)ctx_local;
}

Assistant:

SynIfElse* ParseIfElse(ParseContext &ctx, bool forceStaticIf)
{
	Lexeme *start = ctx.currentLexeme;

	bool staticIf = forceStaticIf || ctx.Consume(lex_at);

	if(ctx.Consume(lex_if))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'if'");

		Lexeme *conditionPos = ctx.currentLexeme;

		SynBase *condition = NULL;

		if(!staticIf)
		{
			if(SynBase *type = ParseType(ctx))
			{
				IntrusiveList<SynVariableDefinition> definitions;

				if(SynVariableDefinition *definition = ParseVariableDefinition(ctx))
				{
					definitions.push_back(definition);

					condition = new (ctx.get<SynVariableDefinitions>()) SynVariableDefinitions(start, ctx.Previous(), NULL, type, definitions);
				}
				else
				{
					ctx.currentLexeme = conditionPos;
				}
			}
		}

		if(!condition)
			condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: condition not found in 'if' statement");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after 'if' condition");

		SynBase *trueBlock = ParseExpression(ctx);

		if(!trueBlock)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after 'if'");

			trueBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		SynBase *falseBlock = NULL;

		if(staticIf && ctx.At(lex_semicolon))
			ctx.Skip();

		if(ctx.Consume(lex_else))
		{
			if(ctx.At(lex_if))
				falseBlock = ParseIfElse(ctx, staticIf);
			else
				falseBlock = ParseExpression(ctx);

			if(!falseBlock)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after 'else'");

				falseBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			if(staticIf && ctx.At(lex_semicolon))
				ctx.Skip();
		}

		return new (ctx.get<SynIfElse>()) SynIfElse(start, ctx.Previous(), staticIf, condition, trueBlock, falseBlock);
	}

	if(staticIf)
	{
		// Backtrack
		ctx.currentLexeme = start;
	}

	return NULL;
}